

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

vector<calc::Token,_std::allocator<calc::Token>_> *
calc::tokenize(vector<calc::Token,_std::allocator<calc::Token>_> *__return_storage_ptr__,string *str
              )

{
  char first;
  int iVar1;
  istream *piVar2;
  logic_error *this;
  bool bVar3;
  int iVar4;
  char c;
  allocator local_219;
  string wrongExpr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string error;
  istringstream iss;
  
  (__return_storage_ptr__->super__Vector_base<calc::Token,_std::allocator<calc::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<calc::Token,_std::allocator<calc::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<calc::Token,_std::allocator<calc::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)str,_S_in);
  bVar3 = true;
LAB_001094dd:
  do {
    piVar2 = std::operator>>((istream *)&iss,&c);
    first = c;
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      return __return_storage_ptr__;
    }
    iVar4 = (int)c;
    iVar1 = isspace(iVar4);
  } while (iVar1 != 0);
  switch(first) {
  case '(':
    wrongExpr._M_dataplus._M_p = (pointer)&wrongExpr.field_2;
    wrongExpr.field_2._M_allocated_capacity._0_2_ = 0x28;
    wrongExpr._M_string_length = 1;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,(Token *)&wrongExpr);
    break;
  case ')':
    wrongExpr._M_dataplus._M_p = (pointer)&wrongExpr.field_2;
    wrongExpr.field_2._M_allocated_capacity._0_2_ = 0x29;
    wrongExpr._M_string_length = 1;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,(Token *)&wrongExpr);
LAB_00109628:
    std::__cxx11::string::~string((string *)&wrongExpr);
    bVar3 = false;
    goto LAB_001094dd;
  default:
    if (iVar4 - 0x30U < 10) {
      anon_unknown.dwarf_1a3d8::tokenizeNumber((Token *)&wrongExpr,(istream *)&iss,first);
      std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
                (__return_storage_ptr__,(Token *)&wrongExpr);
      goto LAB_00109628;
    }
    if ((first != '/') && (first != '*')) {
      wrongExpr._M_dataplus._M_p = (pointer)&wrongExpr.field_2;
      wrongExpr._M_string_length = 0;
      wrongExpr.field_2._M_allocated_capacity._0_2_ =
           wrongExpr.field_2._M_allocated_capacity._0_2_ & 0xff00;
      std::operator>>((istream *)&iss,(string *)&wrongExpr);
      std::__cxx11::string::insert(&wrongExpr,wrongExpr._M_dataplus._M_p,(int)c);
      std::__cxx11::string::string((string *)&local_1f0,"Incorrect input: ",&local_219);
      std::operator+(&error,&local_1f0,&wrongExpr);
      std::__cxx11::string::~string((string *)&local_1f0);
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,error._M_dataplus._M_p);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    wrongExpr._M_dataplus._M_p = (pointer)&wrongExpr.field_2;
    wrongExpr._M_string_length = 1;
    wrongExpr.field_2._M_local_buf[1] = 0;
    wrongExpr.field_2._M_local_buf[0] = first;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,(Token *)&wrongExpr);
    break;
  case '+':
  case '-':
    if (bVar3) {
      anon_unknown.dwarf_1a3d8::tokenizeNumber((Token *)&wrongExpr,(istream *)&iss,first);
      std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
                (__return_storage_ptr__,(Token *)&wrongExpr);
      goto LAB_00109628;
    }
    wrongExpr._M_dataplus._M_p = (pointer)&wrongExpr.field_2;
    wrongExpr._M_string_length = 1;
    wrongExpr.field_2._M_local_buf[1] = 0;
    wrongExpr.field_2._M_local_buf[0] = first;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,(Token *)&wrongExpr);
  }
  std::__cxx11::string::~string((string *)&wrongExpr);
  bVar3 = true;
  goto LAB_001094dd;
}

Assistant:

vector<Token> calc::tokenize(string str)
{
	vector<Token> result;

	istringstream iss(move(str));
	bool unary = true;
	char c;
	while (iss >> c)
	{
		if (isspace(c))
		{
			continue;
		}
		else if (c == '(')
		{
			result.push_back({ {c}, TokenType::LEFT_BRACKET });
			unary = true;
		}
		else if (c == ')')
		{
			result.push_back({ {c}, TokenType::RIGHT_BRACKET });
			unary = false;
		}
		else if (c == '-' || c == '+')
		{
			if (unary)
			{
				result.push_back(tokenizeNumber(iss, c));
				unary = false;
			}
			else
			{
				result.push_back({ {c}, TokenType::OPERATION });
				unary = true;
			}
		}
		else if (isdigit(c))
		{
			result.push_back(tokenizeNumber(iss, c));
			unary = false;
		}
		else if (c == '/' || c == '*')
		{
			result.push_back({ {c}, TokenType::OPERATION });
			unary = true;
		}
		else
		{
			string wrongExpr;
			iss >> wrongExpr;
			wrongExpr.insert(begin(wrongExpr), c);
			string error = string("Incorrect input: ") + wrongExpr;
			throw logic_error(error.c_str());
		}
	}

	return result;
}